

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

Value __thiscall
MiniScript::Parser::ParseSeqLookup(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  long *plVar1;
  int iVar2;
  LexerStorage *pLVar3;
  long lVar4;
  ParseState *pPVar5;
  undefined3 uVar6;
  undefined4 uVar7;
  undefined7 in_register_00000011;
  Lexer *this_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar8;
  undefined4 in_R8D;
  Value VVar9;
  Value temp;
  Value index2;
  Value index2_1;
  undefined1 local_2f0 [8];
  anon_union_8_3_2f476f46_for_data local_2e8;
  undefined1 local_2e0 [8];
  anon_union_8_3_2f476f46_for_data local_2d8;
  char local_2d0;
  Value local_2c0;
  Value local_2b0;
  Value local_2a0;
  Value local_290;
  Value local_280;
  Value local_270;
  bool local_260 [8];
  long *local_258;
  undefined4 local_24c;
  Value local_248;
  Value local_238;
  Value local_228;
  Value local_218;
  Value local_208;
  Value local_1f8;
  Value local_1e8;
  String local_1d8;
  Lexer local_1c8;
  List<MiniScript::TACLine> local_1c0;
  Lexer local_1b0;
  List<MiniScript::TACLine> local_1a8;
  Lexer local_198;
  undefined1 local_190 [8];
  long *local_188;
  Lexer local_180;
  Lexer local_178;
  TACLine local_170;
  TACLine local_110;
  Token local_b0;
  Token local_90;
  Token local_70;
  Token local_50;
  
  this_00 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_198.ls = this_00->ls;
  if (local_198.ls != (LexerStorage *)0x0) {
    (local_198.ls)->refCount = (local_198.ls)->refCount + 1;
  }
  local_24c = in_R8D;
  ParseMap(this,tokens,SUB81(&local_198,0),statementStart);
  Lexer::release(&local_198);
  do {
    Lexer::Peek((Token *)local_2e0,this_00);
    uVar7 = local_2e0._0_4_;
    aVar8 = extraout_RDX;
    if ((local_2d8.ref != (RefCountedStorage *)0x0) && (local_2d0 == '\0')) {
      plVar1 = &(local_2d8.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_00;
      }
      local_2d8.number = 0.0;
    }
    if (uVar7 != 0x1a) {
      VVar9.data.number = aVar8.number;
      VVar9._0_8_ = this;
      return VVar9;
    }
    Lexer::Dequeue(&local_50,this_00);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar1 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_260[0] = *(bool *)&(this->errorContext).ss;
    local_260[1] = *(bool *)((long)&(this->errorContext).ss + 1);
    local_260[2] = *(bool *)((long)&(this->errorContext).ss + 2);
    local_258 = *(long **)&(this->errorContext).isTemp;
    if ((2 < local_260[0]) && (local_258 != (long *)0x0)) {
      local_258[1] = local_258[1] + 1;
    }
    FullyEvaluate((Parser *)local_2f0,(Value *)tokens,(LocalOnlyMode)local_260);
    Value::operator=((Value *)this,(Value *)local_2f0);
    if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_2e8.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_2e8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_2e8.number = 0.0;
    }
    if ((2 < local_260[0]) && (local_258 != (long *)0x0)) {
      plVar1 = local_258 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*local_258 + 8))();
      }
      local_258 = (long *)0x0;
    }
    Lexer::Peek((Token *)local_2e0,this_00);
    uVar7 = local_2e0._0_4_;
    if ((local_2d8.ref != (RefCountedStorage *)0x0) && (local_2d0 == '\0')) {
      plVar1 = &(local_2d8.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_2d8.number = 0.0;
    }
    if (uVar7 == 0x21) {
      Lexer::Dequeue(&local_70,this_00);
      if ((local_70.text.ss != (StringStorage *)0x0) && (local_70.text.isTemp == false)) {
        plVar1 = &((local_70.text.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_70.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_70.text.ss = (StringStorage *)0x0;
      }
      local_178.ls = this_00->ls;
      if (local_178.ls != (LexerStorage *)0x0) {
        (local_178.ls)->refCount = (local_178.ls)->refCount + 1;
      }
      ParseExpr((Parser *)local_2e0,tokens,SUB81(&local_178,0),false);
      Lexer::release(&local_178);
      pLVar3 = tokens[6].ls;
      iVar2 = *(int *)&(pLVar3->pending).ls;
      *(int *)&(pLVar3->pending).ls = iVar2 + 1;
      local_2f0[0] = Temp;
      local_2f0[1] = false;
      local_2f0[2] = Off;
      local_2e8.tempNum = iVar2;
      List<MiniScript::TACLine>::List(&local_1a8,(List<MiniScript::TACLine> *)pLVar3);
      uVar7 = local_2e0._0_4_;
      local_270.type = *(ValueType *)&(this->errorContext).ss;
      local_270.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
      local_270.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
      local_270.data =
           (anon_union_8_3_2f476f46_for_data)
           *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
      if ((2 < local_270.type) && (local_270.data.ref != (RefCountedStorage *)0x0)) {
        (local_270.data.ref)->refCount = (local_270.data.ref)->refCount + 1;
      }
      local_228.type = Value::null;
      local_228.noInvoke = DAT_001d3321._0_1_;
      local_228.localOnly = DAT_001d3321._1_1_;
      local_228.data.ref = &DAT_001d3328->super_RefCountedStorage;
      if ((Temp < Value::null) && (DAT_001d3328 != (ListStorage<MiniScript::TACLine> *)0x0)) {
        plVar1 = &(DAT_001d3328->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
      local_1e8.type = local_2e0[0];
      local_1e8.noInvoke = (bool)local_2e0[1];
      local_1e8.localOnly = local_2e0[2];
      local_1e8.data.number = local_2d8.number;
      if ((Temp < local_2e0[0]) && (local_2d8.ref != (RefCountedStorage *)0x0)) {
        (local_2d8.ref)->refCount = (local_2d8.ref)->refCount + 1;
      }
      local_2e0._0_4_ = uVar7;
      Intrinsics::CompileSlice(&local_1a8,&local_270,&local_228,&local_1e8,local_2e8.tempNum);
      if ((Temp < local_1e8.type) && (local_1e8.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_1e8.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_1e8.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_1e8.data.number = 0.0;
      }
      if ((Temp < local_228.type) &&
         ((ListStorage<MiniScript::TACLine> *)local_228.data.ref !=
          (ListStorage<MiniScript::TACLine> *)0x0)) {
        plVar1 = &(local_228.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_228.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_228.data.number = 0.0;
      }
      if ((2 < local_270.type) && (local_270.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_270.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_270.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_270.data.number = 0.0;
      }
      if ((local_1a8.ls != (ListStorage<MiniScript::TACLine> *)0x0) && (local_1a8.isTemp == false))
      {
        plVar1 = &((local_1a8.ls)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_1a8.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          local_1a8.ls = (ListStorage<MiniScript::TACLine> *)0x0;
        }
      }
      Value::operator=((Value *)this,(Value *)local_2f0);
      if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_2e8.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_2e8.ref)->_vptr_RefCountedStorage[1])();
        }
        local_2e8.number = 0.0;
      }
      if ((2 < local_2e0[0]) && (local_2d8.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_2d8.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
        }
        local_2d8.number = 0.0;
      }
    }
    else {
      local_180.ls = this_00->ls;
      if (local_180.ls != (LexerStorage *)0x0) {
        (local_180.ls)->refCount = (local_180.ls)->refCount + 1;
      }
      ParseExpr((Parser *)local_2f0,tokens,SUB81(&local_180,0),false);
      Lexer::release(&local_180);
      Lexer::Peek((Token *)local_2e0,this_00);
      uVar7 = local_2e0._0_4_;
      if ((local_2d8.ref != (RefCountedStorage *)0x0) && (local_2d0 == '\0')) {
        plVar1 = &(local_2d8.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
        }
        local_2d8.number = 0.0;
      }
      uVar6 = local_2f0._0_3_;
      if (uVar7 == 0x21) {
        Lexer::Dequeue(&local_90,this_00);
        if ((local_90.text.ss != (StringStorage *)0x0) && (local_90.text.isTemp == false)) {
          plVar1 = &((local_90.text.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_90.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_90.text.ss = (StringStorage *)0x0;
        }
        local_2c0.type = Value::null;
        local_2c0.noInvoke = DAT_001d3321._0_1_;
        local_2c0.localOnly = DAT_001d3321._1_1_;
        local_2c0.data.ref = &DAT_001d3328->super_RefCountedStorage;
        if ((Temp < Value::null) && (DAT_001d3328 != (ListStorage<MiniScript::TACLine> *)0x0)) {
          plVar1 = &(DAT_001d3328->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + 1;
        }
        Lexer::Peek((Token *)local_2e0,this_00);
        uVar7 = local_2e0._0_4_;
        if ((local_2d8.ref != (RefCountedStorage *)0x0) && (local_2d0 == '\0')) {
          plVar1 = &(local_2d8.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
          }
          local_2d8.number = 0.0;
        }
        if (uVar7 != 0x1b) {
          local_1b0.ls = this_00->ls;
          if (local_1b0.ls != (LexerStorage *)0x0) {
            (local_1b0.ls)->refCount = (local_1b0.ls)->refCount + 1;
          }
          ParseExpr((Parser *)local_190,tokens,SUB81(&local_1b0,0),false);
          Value::operator=(&local_2c0,(Value *)local_190);
          if ((2 < local_190[0]) && (local_188 != (long *)0x0)) {
            plVar1 = local_188 + 1;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (**(code **)(*local_188 + 8))();
            }
            local_188 = (long *)0x0;
          }
          Lexer::release(&local_1b0);
        }
        pLVar3 = tokens[6].ls;
        iVar2 = *(int *)&(pLVar3->pending).ls;
        *(int *)&(pLVar3->pending).ls = iVar2 + 1;
        local_2e0._0_3_ = 2;
        local_2d8.tempNum = iVar2;
        List<MiniScript::TACLine>::List(&local_1c0,(List<MiniScript::TACLine> *)pLVar3);
        uVar6 = local_2f0._0_3_;
        local_280.type = *(ValueType *)&(this->errorContext).ss;
        local_280.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
        local_280.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
        local_280.data =
             (anon_union_8_3_2f476f46_for_data)
             *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
        if ((2 < local_280.type) && (local_280.data.ref != (RefCountedStorage *)0x0)) {
          (local_280.data.ref)->refCount = (local_280.data.ref)->refCount + 1;
        }
        local_238.type = local_2f0[0];
        local_238.noInvoke = (bool)local_2f0[1];
        local_238.localOnly = local_2f0[2];
        local_238.data.number = local_2e8.number;
        if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
          (local_2e8.ref)->refCount = (local_2e8.ref)->refCount + 1;
        }
        local_1f8.type = local_2c0.type;
        local_1f8.noInvoke = local_2c0.noInvoke;
        local_1f8.localOnly = local_2c0.localOnly;
        local_1f8.data.number = local_2c0.data.number;
        if ((Temp < local_2c0.type) &&
           ((ListStorage<MiniScript::TACLine> *)local_2c0.data.ref !=
            (ListStorage<MiniScript::TACLine> *)0x0)) {
          (local_2c0.data.ref)->refCount = (local_2c0.data.ref)->refCount + 1;
        }
        local_2f0._0_3_ = uVar6;
        Intrinsics::CompileSlice(&local_1c0,&local_280,&local_238,&local_1f8,local_2d8._0_4_);
        if ((Temp < local_1f8.type) &&
           ((ListStorage<MiniScript::TACLine> *)local_1f8.data.ref !=
            (ListStorage<MiniScript::TACLine> *)0x0)) {
          plVar1 = &(local_1f8.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((RefCountedStorage *)&(local_1f8.data.ref)->_vptr_RefCountedStorage)->
              _vptr_RefCountedStorage[1])();
          }
          local_1f8.data.number = 0.0;
        }
        if ((Temp < local_238.type) && (local_238.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_238.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_238.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_238.data.number = 0.0;
        }
        if ((2 < local_280.type) && (local_280.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_280.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_280.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_280.data.number = 0.0;
        }
        if ((local_1c0.ls != (ListStorage<MiniScript::TACLine> *)0x0) && (local_1c0.isTemp == false)
           ) {
          plVar1 = &((local_1c0.ls)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_1c0.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            local_1c0.ls = (ListStorage<MiniScript::TACLine> *)0x0;
          }
        }
        Value::operator=((Value *)this,(Value *)local_2e0);
        if ((2 < local_2e0[0]) && (local_2d8.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_2d8.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
          }
          local_2d8.number = 0.0;
        }
LAB_0017ccfa:
        if ((Temp < local_2c0.type) &&
           ((ListStorage<MiniScript::TACLine> *)local_2c0.data.ref !=
            (ListStorage<MiniScript::TACLine> *)0x0)) {
          plVar1 = &(local_2c0.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((RefCountedStorage *)&(local_2c0.data.ref)->_vptr_RefCountedStorage)->
              _vptr_RefCountedStorage[1])();
          }
          local_2c0.data.number = 0.0;
        }
      }
      else {
        if ((char)local_24c != '\0') {
          if (*(char *)&(this->errorContext).ss == '\b') {
            lVar4 = *(long *)&(this->errorContext).isTemp;
            pPVar5 = (ParseState *)tokens[6].ls;
            local_2d8.tempNum = pPVar5->nextTempNum;
            pPVar5->nextTempNum = local_2d8.tempNum + 1;
            local_2e0._0_3_ = 2;
            local_208.type = Temp;
            local_208.noInvoke = false;
            local_208.localOnly = Off;
            local_208.data = local_2d8;
            local_290.type = *(byte *)(lVar4 + 0x10);
            local_290.noInvoke = *(bool *)(lVar4 + 0x11);
            local_290.localOnly = *(LocalOnlyMode *)(lVar4 + 0x12);
            local_290.data =
                 (anon_union_8_3_2f476f46_for_data)
                 ((anon_union_8_3_2f476f46_for_data *)(lVar4 + 0x18))->ref;
            if ((2 < local_290.type) &&
               ((ListStorage<MiniScript::JumpPoint> *)local_290.data.ref !=
                (ListStorage<MiniScript::JumpPoint> *)0x0)) {
              (local_290.data.ref)->refCount = (local_290.data.ref)->refCount + 1;
            }
            local_2a0.type = *(byte *)(lVar4 + 0x20);
            local_2a0.noInvoke = *(bool *)(lVar4 + 0x21);
            local_2a0.localOnly = *(LocalOnlyMode *)(lVar4 + 0x22);
            local_2a0.data =
                 (anon_union_8_3_2f476f46_for_data)
                 ((anon_union_8_3_2f476f46_for_data *)(lVar4 + 0x28))->ref;
            if ((2 < local_2a0.type) &&
               ((ListStorage<MiniScript::BackPatch> *)local_2a0.data.ref !=
                (ListStorage<MiniScript::BackPatch> *)0x0)) {
              (local_2a0.data.ref)->refCount = (local_2a0.data.ref)->refCount + 1;
            }
            TACLine::TACLine(&local_110,&local_208,ElemBofA,&local_290,&local_2a0);
            ParseState::Add(pPVar5,&local_110);
            if ((local_110.location.context.ss != (StringStorage *)0x0) &&
               (local_110.location.context.isTemp == false)) {
              plVar1 = &((local_110.location.context.ss)->super_RefCountedStorage).refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*((local_110.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage
                  [1])();
              }
              local_110.location.context.ss = (StringStorage *)0x0;
            }
            if ((local_110.comment.ss != (StringStorage *)0x0) &&
               (local_110.comment.isTemp == false)) {
              plVar1 = &((local_110.comment.ss)->super_RefCountedStorage).refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*((local_110.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
              }
              local_110.comment.ss = (StringStorage *)0x0;
            }
            if ((Temp < local_110.rhsB.type) &&
               (local_110.rhsB.data.ref != (RefCountedStorage *)0x0)) {
              plVar1 = &(local_110.rhsB.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(local_110.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_110.rhsB.data.number = 0.0;
            }
            if ((Temp < local_110.rhsA.type) &&
               (local_110.rhsA.data.ref != (RefCountedStorage *)0x0)) {
              plVar1 = &(local_110.rhsA.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(local_110.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_110.rhsA.data.number = 0.0;
            }
            if ((2 < local_110.lhs.type) && (local_110.lhs.data.ref != (RefCountedStorage *)0x0)) {
              plVar1 = &(local_110.lhs.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(local_110.lhs.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_110.lhs.data.number = 0.0;
            }
            if ((2 < local_2a0.type) &&
               ((ListStorage<MiniScript::BackPatch> *)local_2a0.data.ref !=
                (ListStorage<MiniScript::BackPatch> *)0x0)) {
              plVar1 = &(local_2a0.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*((RefCountedStorage *)&(local_2a0.data.ref)->_vptr_RefCountedStorage)->
                  _vptr_RefCountedStorage[1])();
              }
              local_2a0.data.number = 0.0;
            }
            if ((2 < local_290.type) &&
               ((ListStorage<MiniScript::JumpPoint> *)local_290.data.ref !=
                (ListStorage<MiniScript::JumpPoint> *)0x0)) {
              plVar1 = &(local_290.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*((RefCountedStorage *)&(local_290.data.ref)->_vptr_RefCountedStorage)->
                  _vptr_RefCountedStorage[1])();
              }
              local_290.data.number = 0.0;
            }
            if ((Temp < local_208.type) && (local_208.data.ref != (RefCountedStorage *)0x0)) {
              plVar1 = &(local_208.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(local_208.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_208.data.number = 0.0;
            }
            Value::operator=((Value *)this,(Value *)local_2e0);
            if ((2 < local_2e0[0]) && (local_2d8.ref != (RefCountedStorage *)0x0)) {
              plVar1 = &(local_2d8.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
              }
              local_2d8.number = 0.0;
            }
          }
          Value::SeqElem(&local_2c0,(Value *)this,(Value *)local_2f0);
          Value::operator=((Value *)this,&local_2c0);
          goto LAB_0017ccfa;
        }
        pPVar5 = (ParseState *)tokens[6].ls;
        local_2d8.tempNum = pPVar5->nextTempNum;
        pPVar5->nextTempNum = local_2d8.tempNum + 1;
        local_2e0._0_3_ = 2;
        local_218.type = Temp;
        local_218.noInvoke = false;
        local_218.localOnly = Off;
        local_218.data = local_2d8;
        local_2b0.type = *(ValueType *)&(this->errorContext).ss;
        local_2b0.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
        local_2b0.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
        local_2b0.data =
             (anon_union_8_3_2f476f46_for_data)
             *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
        if ((2 < local_2b0.type) &&
           ((ListStorage<MiniScript::BackPatch> *)local_2b0.data.ref !=
            (ListStorage<MiniScript::BackPatch> *)0x0)) {
          (local_2b0.data.ref)->refCount = (local_2b0.data.ref)->refCount + 1;
        }
        local_248.type = local_2f0[0];
        local_248.noInvoke = (bool)local_2f0[1];
        local_248.localOnly = local_2f0[2];
        local_248.data.number = local_2e8.number;
        if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
          (local_2e8.ref)->refCount = (local_2e8.ref)->refCount + 1;
        }
        local_2f0._0_3_ = uVar6;
        TACLine::TACLine(&local_170,&local_218,ElemBofA,&local_2b0,&local_248);
        ParseState::Add(pPVar5,&local_170);
        if ((local_170.location.context.ss != (StringStorage *)0x0) &&
           (local_170.location.context.isTemp == false)) {
          plVar1 = &((local_170.location.context.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_170.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])
                      ();
          }
          local_170.location.context.ss = (StringStorage *)0x0;
        }
        if ((local_170.comment.ss != (StringStorage *)0x0) && (local_170.comment.isTemp == false)) {
          plVar1 = &((local_170.comment.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_170.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_170.comment.ss = (StringStorage *)0x0;
        }
        if ((Temp < local_170.rhsB.type) && (local_170.rhsB.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_170.rhsB.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_170.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_170.rhsB.data.number = 0.0;
        }
        if ((Temp < local_170.rhsA.type) && (local_170.rhsA.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_170.rhsA.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_170.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_170.rhsA.data.number = 0.0;
        }
        if ((Temp < local_170.lhs.type) && (local_170.lhs.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_170.lhs.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_170.lhs.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_170.lhs.data.number = 0.0;
        }
        if ((Temp < local_248.type) && (local_248.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_248.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_248.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_248.data.number = 0.0;
        }
        if ((2 < local_2b0.type) &&
           ((ListStorage<MiniScript::BackPatch> *)local_2b0.data.ref !=
            (ListStorage<MiniScript::BackPatch> *)0x0)) {
          plVar1 = &(local_2b0.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((RefCountedStorage *)&(local_2b0.data.ref)->_vptr_RefCountedStorage)->
              _vptr_RefCountedStorage[1])();
          }
          local_2b0.data.number = 0.0;
        }
        if ((Temp < local_218.type) && (local_218.data.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_218.data.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_218.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_218.data.number = 0.0;
        }
        Value::operator=((Value *)this,(Value *)local_2e0);
        if ((2 < local_2e0[0]) && (local_2d8.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_2d8.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_2d8.ref)->_vptr_RefCountedStorage[1])();
          }
          local_2d8.number = 0.0;
        }
      }
      if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_2e8.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_2e8.ref)->_vptr_RefCountedStorage[1])();
        }
        local_2e8.number = 0.0;
      }
    }
    local_1c8.ls = this_00->ls;
    if (local_1c8.ls != (LexerStorage *)0x0) {
      (local_1c8.ls)->refCount = (local_1c8.ls)->refCount + 1;
    }
    local_1d8.ss = (StringStorage *)0x0;
    local_1d8.isTemp = false;
    RequireToken(&local_b0,(Parser *)tokens,&local_1c8,RSquare,&local_1d8);
    if ((local_b0.text.ss != (StringStorage *)0x0) && (local_b0.text.isTemp == false)) {
      plVar1 = &((local_b0.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.text.ss = (StringStorage *)0x0;
    }
    if ((local_1d8.ss != (StringStorage *)0x0) && (local_1d8.isTemp == false)) {
      plVar1 = &((local_1d8.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_1d8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_1d8.ss = (StringStorage *)0x0;
    }
    Lexer::release(&local_1c8);
  } while( true );
}

Assistant:

Value Parser::ParseSeqLookup(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMap;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);

		while (tokens.Peek().type == Token::Type::LSquare) {
			tokens.Dequeue();	// discard '['
			val = FullyEvaluate(val);

			if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[:4]
				tokens.Dequeue();	// discard ':'
				Value index2 = ParseExpr(tokens);
				Value temp = Value::Temp(output->nextTempNum++);
				Intrinsics::CompileSlice(output->code, val, Value::null, index2, temp.data.tempNum);
				val = temp;
			} else {
				Value index = ParseExpr(tokens);
				if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[2:4] or foo[2:]
					tokens.Dequeue();	// discard ':'
					Value index2 = Value::null;
					if (tokens.Peek().type != Token::Type::RSquare) index2 = ParseExpr(tokens);
					Value temp = Value::Temp(output->nextTempNum++);
					Intrinsics::CompileSlice(output->code, val, index, index2, temp.data.tempNum);
					val = temp;
				} else {			// e.g., foo[3]  (not a slice at all)
					if (statementStart) {
						// At the start of a statement, we don't want to compile the
						// last sequence lookup, because we might have to convert it into
						// an assignment.  But we want to compile any previous one.
						if (val.type == ValueType::SeqElem) {
							SeqElemStorage *vsVal = (SeqElemStorage*)val.data.ref;
							Value temp = Value::Temp(output->nextTempNum++);
							output->Add(TACLine(temp, TACLine::Op::ElemBofA, vsVal->sequence, vsVal->index));
							val = temp;
						}
						val = Value::SeqElem(val, index);
					} else {
						// Anywhere else in an expression, we can compile the lookup right away.
						Value temp = Value::Temp(output->nextTempNum++);
						output->Add(TACLine(temp, TACLine::Op::ElemBofA, val, index));
						val = temp;
					}
				}
			}

			RequireToken(tokens, Token::Type::RSquare);
		}
		return val;
	}